

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O0

Box * __thiscall libDAI::Box::boundSumProd(Box *this,Factor *psi,VarSet *dest,bool normed)

{
  TFactor<double> *pTVar1;
  Box *in_RCX;
  TProb<double> *in_RDX;
  VarSet *in_RSI;
  Box *in_RDI;
  byte in_R8B;
  Prob image_ep;
  size_t l;
  Prob image_max;
  Prob image_min;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  TProb<double> *in_stack_fffffffffffffe48;
  TFactor<double> *in_stack_fffffffffffffe50;
  Box *this_00;
  TProb<double> *in_stack_fffffffffffffe88;
  TProb<double> *in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffeaf;
  VarSet *in_stack_fffffffffffffeb0;
  TFactor<double> *in_stack_fffffffffffffeb8;
  Box *in_stack_fffffffffffffed8;
  TFactor<double> local_d8;
  TFactor<double> *in_stack_ffffffffffffff70;
  TFactor<double> *pTVar2;
  TFactor<double> *this_01;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_40;
  byte local_21;
  
  local_21 = in_R8B & 1;
  this_00 = in_RDI;
  extremePoints(in_stack_fffffffffffffed8);
  VarSet::stateSpace(&in_RCX->_vars);
  TProb<double>::TProb(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,(Real)in_RCX);
  VarSet::stateSpace(&in_RCX->_vars);
  TProb<double>::TProb(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,(Real)in_RCX);
  pTVar2 = (TFactor<double> *)0x0;
  while( true ) {
    this_01 = pTVar2;
    pTVar1 = (TFactor<double> *)
             std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::size
                       (&local_40);
    if (pTVar1 <= pTVar2) break;
    TProb<double>::TProb((TProb<double> *)in_stack_fffffffffffffe50);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              (&local_40,(size_type)this_01);
    TFactor<double>::TFactor((TFactor<double> *)this_00,&in_RDI->_vars,in_RDX);
    TFactor<double>::operator*(this_01,in_stack_ffffffffffffff70);
    TFactor<double>::marginal
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf);
    in_stack_fffffffffffffe50 = (TFactor<double> *)TFactor<double>::p(&local_d8);
    TProb<double>::operator=((TProb<double> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TFactor<double>::~TFactor(in_stack_fffffffffffffe50);
    TFactor<double>::~TFactor(in_stack_fffffffffffffe50);
    TFactor<double>::~TFactor(in_stack_fffffffffffffe50);
    min<double>(in_stack_fffffffffffffe88,(TProb<double> *)in_RCX);
    TProb<double>::operator=((TProb<double> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TProb<double>::~TProb((TProb<double> *)0xb1a2f1);
    max<double>(in_stack_fffffffffffffe88,(TProb<double> *)in_RCX);
    TProb<double>::operator=((TProb<double> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TProb<double>::~TProb((TProb<double> *)0xb1a32b);
    TProb<double>::~TProb((TProb<double> *)0xb1a338);
    pTVar2 = (TFactor<double> *)
             ((long)&(this_01->_vs)._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  Box(in_RCX,in_RSI,(Prob *)this_00,(Prob *)in_RDI);
  TProb<double>::~TProb((TProb<double> *)0xb1a496);
  TProb<double>::~TProb((TProb<double> *)0xb1a4a3);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)in_RDX);
  return this_00;
}

Assistant:

Box boundSumProd(Factor psi, VarSet dest, bool normed) const {
                // FIXME: do we have to store the extreme points?
                std::vector<Prob> ep = extremePoints();
                Prob image_min( dest.stateSpace(), INFINITY );
                Prob image_max( dest.stateSpace(), -INFINITY );
                for( size_t l = 0; l < ep.size(); l++ ) {
                    // FIXME: this can be sped up massively by caching the index
                    Prob image_ep;
                    image_ep = (psi * Factor(_vars,ep[l])).marginal(dest,normed).p();
                    image_min = libDAI::min( image_ep, image_min );
                    image_max = libDAI::max( image_ep, image_max );
                }
                return Box( dest, image_min, image_max );
            }